

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

bool __thiscall trun::Process_Unix::SetNonBlockingPipe(Process_Unix *this,int *filedes)

{
  ILogger *pIVar1;
  int *piVar2;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  int local_24;
  int *piStack_20;
  int status;
  int *filedes_local;
  Process_Unix *this_local;
  
  piStack_20 = filedes;
  filedes_local = (int *)this;
  local_24 = fcntl(*filedes,0x800);
  if (local_24 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Process_Unix",&local_49)
    ;
    pIVar1 = gnilk::Logger::GetLogger(&local_48);
    piVar2 = __errno_location();
    gnilk::Log::Error<char_const*,int>(pIVar1,"fcntl %d",*piVar2);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = false;
  }
  else {
    local_24 = fcntl(piStack_20[1],0x800);
    if (local_24 == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"conapp",&local_81);
      pIVar1 = gnilk::Logger::GetLogger(&local_80);
      piVar2 = __errno_location();
      gnilk::Log::Error<char_const*,int>(pIVar1,"fcntl %d",*piVar2);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator(&local_81);
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Process_Unix::SetNonBlockingPipe(int *filedes) {
	int status = fcntl(filedes[0], O_NONBLOCK);
	if (status == -1) {
        gnilk::Logger::GetLogger("Process_Unix")->Error("fcntl %d", errno);
		return false;
	}
	status = fcntl(filedes[1], O_NONBLOCK);
	if (status == -1) {
        gnilk::Logger::GetLogger("conapp")->Error("fcntl %d", errno);
		return false;			
	}
	return true;
}